

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  global_State *pgVar1;
  int iVar2;
  GCObject *pGVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  TString *ts;
  
  uVar7 = l & 0xffffffff;
  for (sVar6 = l; uVar4 = (uint)uVar7, l >> 5 < sVar6; sVar6 = sVar6 + ~(l >> 5)) {
    uVar7 = (ulong)(uVar4 ^ (uint)(byte)str[sVar6 - 1] + (int)(uVar7 >> 2) + uVar4 * 0x20);
  }
  pgVar1 = L->l_G;
  pGVar3 = (GCObject *)((pgVar1->strt).hash + ((long)(int)uVar4 & (long)(pgVar1->strt).size - 1U));
  while (pGVar3 = (pGVar3->gch).next, pGVar3 != (GCObject *)0x0) {
    if (((pGVar3->h).metatable == (Table *)l) && (iVar2 = bcmp(str,&pGVar3->ts + 1,l), iVar2 == 0))
    {
      if ((~pgVar1->currentwhite & (pGVar3->gch).marked & 3) != 0) {
        (pGVar3->gch).marked = (pGVar3->gch).marked ^ 3;
      }
      return (TString *)pGVar3;
    }
  }
  if (l + 0x1b < 0x1a) {
    luaM_toobig(L);
  }
  pGVar3 = (GCObject *)luaM_realloc_(L,(void *)0x0,0,l + 0x19);
  (pGVar3->h).metatable = (Table *)l;
  *(uint *)((long)pGVar3 + 0xc) = uVar4;
  (pGVar3->gch).marked = L->l_G->currentwhite & 3;
  (pGVar3->gch).tt = '\x04';
  (pGVar3->h).flags = '\0';
  memcpy(&pGVar3->ts + 1,str,l);
  *(undefined1 *)((long)pGVar3 + l + 0x18) = 0;
  pgVar1 = L->l_G;
  uVar4 = (pgVar1->strt).size - 1U & uVar4;
  (pGVar3->gch).next = (pgVar1->strt).hash[uVar4];
  (pgVar1->strt).hash[uVar4] = pGVar3;
  uVar4 = (pgVar1->strt).size;
  uVar5 = (pgVar1->strt).nuse + 1;
  (pgVar1->strt).nuse = uVar5;
  if (0x3ffffffe < (int)uVar4 || uVar5 <= uVar4) {
    return (TString *)pGVar3;
  }
  luaS_resize(L,uVar4 * 2);
  return (TString *)pGVar3;
}

Assistant:

static TString*luaS_newlstr(lua_State*L,const char*str,size_t l){
GCObject*o;
unsigned int h=cast(unsigned int,l);
size_t step=(l>>5)+1;
size_t l1;
for(l1=l;l1>=step;l1-=step)
h=h^((h<<5)+(h>>2)+cast(unsigned char,str[l1-1]));
for(o=G(L)->strt.hash[lmod(h,G(L)->strt.size)];
o!=NULL;
o=o->gch.next){
TString*ts=rawgco2ts(o);
if(ts->tsv.len==l&&(memcmp(str,getstr(ts),l)==0)){
if(isdead(G(L),o))changewhite(o);
return ts;
}
}
return newlstr(L,str,l,h);
}